

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

void InitEval1(void)

{
  int iVar1;
  reference pvVar2;
  int v_3;
  int u_3;
  int v_2;
  int u_2;
  TBoard board_1;
  double points_1;
  int i_1;
  int v_1;
  int u_1;
  int v;
  int u;
  TBoard board;
  double points;
  short i;
  undefined4 in_stack_ffffffffffffff48;
  value_type_conflict3 in_stack_ffffffffffffff4c;
  value_type_conflict3 in_stack_ffffffffffffff50;
  value_type_conflict3 in_stack_ffffffffffffff54;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  TBoard local_74;
  double local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  TBoard local_34;
  double local_10;
  short local_2;
  
  for (local_2 = 0; local_2 < 0x4ce3; local_2 = local_2 + 1) {
    local_10 = 0.0;
    makeBoard(&local_34,local_2);
    if (g_board_status[local_2] == '\0') {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (*pvVar2 != 0) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            local_10 = (double)(*pvVar2 * -2 + 3) * g_eval_micro_matrix1[local_38][local_3c] +
                       local_10;
          }
        }
      }
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          iVar1 = *pvVar2;
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (iVar1 == *pvVar2) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            if (*pvVar2 != 0) {
              std::array<std::array<int,_3UL>,_3UL>::operator[]
                        ((array<std::array<int,_3UL>,_3UL> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              pvVar2 = std::array<int,_3UL>::operator[]
                                 ((array<int,_3UL> *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              local_10 = (double)(*pvVar2 * -2 + 3) * g_micro_double_bonus1 + local_10;
            }
          }
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          iVar1 = *pvVar2;
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (iVar1 == *pvVar2) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            if (*pvVar2 != 0) {
              std::array<std::array<int,_3UL>,_3UL>::operator[]
                        ((array<std::array<int,_3UL>,_3UL> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              pvVar2 = std::array<int,_3UL>::operator[]
                                 ((array<int,_3UL> *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              local_10 = (double)(*pvVar2 * -2 + 3) * g_micro_double_bonus1 + local_10;
            }
          }
        }
      }
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (*pvVar2 != 0) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        iVar1 = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (iVar1 == *pvVar2) {
LAB_00248ef2:
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          local_10 = (double)(*pvVar2 * -2 + 3) * g_micro_double_bonus1 + local_10;
        }
        else {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          iVar1 = *pvVar2;
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (iVar1 == *pvVar2) goto LAB_00248ef2;
        }
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        iVar1 = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (iVar1 != *pvVar2) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          iVar1 = *pvVar2;
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (iVar1 != *pvVar2) goto LAB_0024902e;
        }
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_10 = (double)(*pvVar2 * -2 + 3) * g_micro_double_bonus1 + local_10;
      }
    }
LAB_0024902e:
    g_eval_micro1[local_2] = local_10;
  }
  local_48 = 0;
  do {
    if (0x3ffff < local_48) {
      return;
    }
    local_50 = 0.0;
    makeBoard4(&local_74,local_48);
    for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (*pvVar2 == 1) {
LAB_002490fa:
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          local_50 = (double)(*pvVar2 * -2 + 3) * g_eval_macro_matrix1[local_78][local_7c] +
                     local_50;
        }
        else {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (*pvVar2 == 2) goto LAB_002490fa;
        }
      }
    }
    for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
      for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        iVar1 = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (iVar1 == *pvVar2) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (*pvVar2 != 0) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            local_50 = (double)(*pvVar2 * -2 + 3) * g_macro_double_bonus1 + local_50;
          }
        }
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        iVar1 = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (iVar1 == *pvVar2) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (*pvVar2 != 0) {
            std::array<std::array<int,_3UL>,_3UL>::operator[]
                      ((array<std::array<int,_3UL>,_3UL> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pvVar2 = std::array<int,_3UL>::operator[]
                               ((array<int,_3UL> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            local_50 = (double)(*pvVar2 * -2 + 3) * g_macro_double_bonus1 + local_50;
          }
        }
      }
    }
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (*pvVar2 == 1) {
LAB_00249370:
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar1 = *pvVar2;
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (iVar1 == *pvVar2) {
LAB_00249400:
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_50 = (double)(*pvVar2 * -2 + 3) * g_macro_double_bonus1 + local_50;
      }
      else {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff54 = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (in_stack_ffffffffffffff54 == *pvVar2) goto LAB_00249400;
      }
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff50 = *pvVar2;
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (in_stack_ffffffffffffff50 != *pvVar2) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff4c = *pvVar2;
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (in_stack_ffffffffffffff4c != *pvVar2) goto LAB_0024951c;
      }
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_50 = (double)(*pvVar2 * -2 + 3) * g_macro_double_bonus1 + local_50;
    }
    else {
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (*pvVar2 == 2) goto LAB_00249370;
    }
LAB_0024951c:
    g_eval_macro1[local_48] = local_50;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void
InitEval1()
{
    for (short i = 0; i < 19683; i++)
    {
        double points = 0.0;
        auto board = makeBoard(i);
        if (g_board_status[i] == 0)
        {
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 3; ++v)
                    if (board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_eval_micro_matrix1[u][v];
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 2; ++v)
                {
                    if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_micro_double_bonus1;
                    if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                        points += (-2 * board[v][u] + 3) * g_micro_double_bonus1;
                }
            if (board[1][1] != 0)
            {
                if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
                if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
            }
        }
        g_eval_micro1[i] = points;
    }

    for (int i = 0; i < 262144; i++)
    {
        double points = 0.0;
        auto board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 1 || board[u][v] == 2)
                    points += (-2 * board[u][v] + 3) * g_eval_macro_matrix1[u][v];
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 2; ++v)
            {
                if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                    points += (-2 * board[u][v] + 3) * g_macro_double_bonus1;
                if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                    points += (-2 * board[v][u] + 3) * g_macro_double_bonus1;
            }
        if (board[1][1] == 1 || board[1][1] == 2)
        {
            if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
            if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
        }
        g_eval_macro1[i] = points;
    }
}